

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManCutSupps(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *vUpper;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  int iVar8;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0;
  puVar5[1] = 0;
  pVVar3->nSize = 1;
  *ppvVar4 = puVar5;
  if (vResult->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar8 = vResult->nSize;
  if (1 < iVar8) {
    lVar7 = 1;
    pVVar6 = (Vec_Ptr_t *)*vResult->pArray;
    do {
      vUpper = (Vec_Ptr_t *)vResult->pArray[lVar7];
      pVVar6 = Llb_ManCutSupp(p,pVVar6,vUpper);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_0082134a;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar8;
      }
LAB_0082134a:
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = pVVar6;
      lVar7 = lVar7 + 1;
      iVar8 = vResult->nSize;
      pVVar6 = vUpper;
    } while (lVar7 < iVar8);
  }
  if (pVVar3->nSize != iVar8) {
    __assert_fail("Vec_PtrSize(vSupps) == Vec_PtrSize(vResult)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                  ,0x4a,"Vec_Ptr_t *Llb_ManCutSupps(Aig_Man_t *, Vec_Ptr_t *)");
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupps( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vSupps, * vOne, * vLower, * vUpper;
    int i;
    vSupps = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vSupps, Vec_PtrAlloc(0) );
    vLower = (Vec_Ptr_t *)Vec_PtrEntry( vResult, 0 );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vResult, vUpper, i, 1 )
    {
        vOne  = Llb_ManCutSupp( p, vLower, vUpper );
        Vec_PtrPush( vSupps, vOne );
        vLower = vUpper;
    }
    assert( Vec_PtrSize(vSupps) == Vec_PtrSize(vResult) );
    return vSupps;
}